

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_patch.c
# Opt level: O1

int json_patch_apply(json_object *copy_from,json_object *patch,json_object **base,
                    json_patch_error *patch_error)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  size_t sVar6;
  json_object *jso;
  char *path;
  size_t sVar7;
  json_patch_error *patch_error_00;
  json_patch_error *pjVar8;
  json_object *jpath;
  json_object *jop;
  json_object *value1;
  json_patch_error placeholder;
  json_object *local_80;
  json_object *local_78;
  json_object *local_70;
  json_pointer_get_result local_68;
  json_patch_error local_48;
  
  patch_error_00 = patch_error;
  if (patch_error == (json_patch_error *)0x0) {
    patch_error_00 = &local_48;
  }
  patch_error_00->patch_failure_idx = 0xffffffffffffffff;
  patch_error_00->errno_code = 0;
  pjVar8 = &local_48;
  if (((base == (json_object **)0x0) ||
      (copy_from == (json_object *)0x0 && *base == (json_object *)0x0)) ||
     (copy_from != (json_object *)0x0 && *base != (json_object *)0x0)) {
    patch_error_00->errno_code = 0xe;
    if (patch_error != (json_patch_error *)0x0) {
      pjVar8 = patch_error;
    }
    pcVar4 = "Exactly one of *base or copy_from must be non-NULL";
  }
  else {
    iVar1 = json_object_is_type(patch,json_type_array);
    if (iVar1 == 0) {
      patch_error_00->errno_code = 0xe;
      if (patch_error != (json_patch_error *)0x0) {
        pjVar8 = patch_error;
      }
      pcVar4 = "Patch object is not of type json_type_array";
    }
    else {
      if ((copy_from == (json_object *)0x0) ||
         (iVar1 = json_object_deep_copy(copy_from,base,(json_c_shallow_copy_fn *)0x0), -1 < iVar1))
      {
        sVar6 = json_object_array_length(patch);
        if (sVar6 == 0) {
          return 0;
        }
        if (patch_error != (json_patch_error *)0x0) {
          pjVar8 = patch_error;
        }
        sVar6 = 0;
        uVar2 = 0;
        do {
          jso = json_object_array_get_idx(patch,sVar6);
          patch_error_00->patch_failure_idx = sVar6;
          iVar1 = json_object_object_get_ex(jso,"op",&local_78);
          if (iVar1 == 0) {
            patch_error_00->errno_code = 0x16;
            pcVar4 = "Patch object does not contain \'op\' field";
LAB_0010a8ff:
            pjVar8->errmsg = pcVar4;
            piVar5 = __errno_location();
            *piVar5 = 0;
            uVar3 = 1;
          }
          else {
            pcVar4 = json_object_get_string(local_78);
            iVar1 = json_object_object_get_ex(jso,"path",&local_80);
            if (iVar1 == 0) {
              patch_error_00->errno_code = 0x16;
              pcVar4 = "Patch object does not contain \'path\' field";
              goto LAB_0010a8ff;
            }
            path = json_object_get_string(local_80);
            iVar1 = strcmp(pcVar4,"test");
            if (iVar1 == 0) {
              iVar1 = json_object_object_get_ex(jso,"value",&local_68.parent);
              if (iVar1 == 0) {
                patch_error_00->errno_code = 0x16;
                pjVar8->errmsg = "Patch object does not contain a \'value\' field";
                piVar5 = __errno_location();
              }
              else {
                iVar1 = json_pointer_get(*base,path,&local_70);
                if (iVar1 == 0) {
                  iVar1 = json_object_equal(local_68.parent,local_70);
                  uVar2 = 0;
                  if (iVar1 != 0) goto LAB_0010aadb;
                  patch_error_00->errno_code = 2;
                  pjVar8->errmsg =
                       "Value of element referenced by \'path\' field did not match \'value\' field"
                  ;
                  piVar5 = __errno_location();
                }
                else {
                  piVar5 = __errno_location();
                  patch_error_00->errno_code = *piVar5;
                  pcVar4 = "Invalid path field";
                  if (*piVar5 == 2) {
                    pcVar4 = "Did not find element referenced by path field";
                  }
                  pjVar8->errmsg = pcVar4;
                }
              }
              *piVar5 = 0;
              uVar2 = 0xffffffff;
            }
            else {
              iVar1 = strcmp(pcVar4,"remove");
              if (iVar1 == 0) {
                iVar1 = json_pointer_get_internal(*base,path,&local_68);
                if (iVar1 == 0) {
                  uVar2 = __json_patch_apply_remove(&local_68);
                  if ((int)uVar2 < 0) {
                    patch_error_00->errno_code = 0x16;
                    pjVar8->errmsg = "Unable to remove path referenced by \'path\' field";
                    piVar5 = __errno_location();
                    *piVar5 = 0;
                  }
                  if (local_68.parent == (json_object *)0x0) {
                    *base = (json_object *)0x0;
                  }
                }
                else {
                  piVar5 = __errno_location();
                  patch_error_00->errno_code = *piVar5;
                  pcVar4 = "Invalid path field";
                  if (*piVar5 == 2) {
                    pcVar4 = "Did not find element referenced by path field";
                  }
                  pjVar8->errmsg = pcVar4;
                  *piVar5 = 0;
                  uVar2 = 0xffffffff;
                }
              }
              else {
                iVar1 = strcmp(pcVar4,"add");
                if (iVar1 == 0) {
                  iVar1 = 1;
                }
                else {
                  iVar1 = strcmp(pcVar4,"replace");
                  if (iVar1 != 0) {
                    iVar1 = strcmp(pcVar4,"move");
                    if (iVar1 == 0) {
                      iVar1 = 1;
                    }
                    else {
                      iVar1 = strcmp(pcVar4,"copy");
                      if (iVar1 != 0) {
                        patch_error_00->errno_code = 0x16;
                        pcVar4 = "Patch object has invalid \'op\' field";
                        goto LAB_0010a8ff;
                      }
                      iVar1 = 0;
                    }
                    uVar2 = json_patch_apply_move_copy(base,jso,path,iVar1,patch_error_00);
                    goto LAB_0010aadb;
                  }
                  iVar1 = 0;
                }
                uVar2 = json_patch_apply_add_replace(base,jso,path,iVar1,patch_error_00);
              }
            }
LAB_0010aadb:
            uVar3 = uVar2 >> 0x1c & 0xfffffff8;
          }
          if (uVar3 != 0) {
            if (uVar3 != 8) {
              return -1;
            }
            return uVar2;
          }
          sVar6 = sVar6 + 1;
          sVar7 = json_object_array_length(patch);
          if (sVar7 <= sVar6) {
            return uVar2;
          }
        } while( true );
      }
      patch_error_00->errno_code = 0xc;
      if (patch_error != (json_patch_error *)0x0) {
        pjVar8 = patch_error;
      }
      pcVar4 = "Unable to copy copy_from using json_object_deep_copy()";
    }
  }
  pjVar8->errmsg = pcVar4;
  piVar5 = __errno_location();
  *piVar5 = 0;
  return -1;
}

Assistant:

int json_patch_apply(struct json_object *copy_from, struct json_object *patch,
                     struct json_object **base, struct json_patch_error *patch_error)
{
	size_t ii;
	int rc = 0;
	struct json_patch_error placeholder;

	if (!patch_error)
		patch_error = &placeholder;

	patch_error->patch_failure_idx = SIZE_T_MAX;
	patch_error->errno_code = 0;

	if (base == NULL|| 
	    (*base == NULL && copy_from == NULL) ||
	    (*base != NULL && copy_from != NULL))
	{
		_set_err(EFAULT, "Exactly one of *base or copy_from must be non-NULL");
		return -1;
	}
	    
	if (!json_object_is_type(patch, json_type_array)) {
		_set_err(EFAULT, "Patch object is not of type json_type_array");
		return -1;
	}

	if (copy_from != NULL)
	{
		if (json_object_deep_copy(copy_from, base, NULL) < 0)
		{
			_set_err(ENOMEM, "Unable to copy copy_from using json_object_deep_copy()");
			return -1;
		}
	}

	/* Go through all operations ; apply them on res */
	for (ii = 0; ii < json_object_array_length(patch); ii++) {
		struct json_object *jop, *jpath;
		struct json_object *patch_elem = json_object_array_get_idx(patch, ii);
		const char *op, *path;

		patch_error->patch_failure_idx = ii;

		if (!json_object_object_get_ex(patch_elem, "op", &jop)) {
			_set_err(EINVAL, "Patch object does not contain 'op' field");
			return -1;
		}
		op = json_object_get_string(jop);
		if (!json_object_object_get_ex(patch_elem, "path", &jpath)) {
			_set_err(EINVAL, "Patch object does not contain 'path' field");
			return -1;
		}
		path = json_object_get_string(jpath); // Note: empty string is ok!

		if (!strcmp(op, "test"))
			rc = json_patch_apply_test(base, patch_elem, path, patch_error);
		else if (!strcmp(op, "remove"))
			rc = json_patch_apply_remove(base, path, patch_error);
		else if (!strcmp(op, "add"))
			rc = json_patch_apply_add_replace(base, patch_elem, path, 1, patch_error);
		else if (!strcmp(op, "replace"))
			rc = json_patch_apply_add_replace(base, patch_elem, path, 0, patch_error);
		else if (!strcmp(op, "move"))
			rc = json_patch_apply_move_copy(base, patch_elem, path, 1, patch_error);
		else if (!strcmp(op, "copy"))
			rc = json_patch_apply_move_copy(base, patch_elem, path, 0, patch_error);
		else {
			_set_err(EINVAL, "Patch object has invalid 'op' field");
			return -1;
		}
		if (rc < 0)
			break;
	}

	return rc;
}